

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestImplicitOutputDupe::Run(ParserTestImplicitOutputDupe *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *this_00;
  size_type sVar5;
  StringPiece local_30;
  Edge *local_20;
  Edge *edge;
  ParserTestImplicitOutputDupe *pPStack_10;
  int fail_count;
  ParserTestImplicitOutputDupe *this_local;
  
  pPStack_10 = this;
  edge._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild foo baz | foo baq foo: cat bar\n");
  iVar2 = edge._4_4_;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    StringPiece::StringPiece(&local_30,"foo");
    this_00 = State::LookupNode(&(this->super_ParserTest).state,local_30);
    local_20 = Node::in_edge(this_00);
    pTVar1 = g_current_test;
    sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_20->outputs_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar5 == 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x3ef,"edge->outputs_.size() == 3");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Edge::is_implicit_out(local_20,0);
      testing::Test::Check
                (pTVar1,(bool)((bVar3 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3f0,"edge->is_implicit_out(0)");
      pTVar1 = g_current_test;
      bVar3 = Edge::is_implicit_out(local_20,1);
      testing::Test::Check
                (pTVar1,(bool)((bVar3 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3f1,"edge->is_implicit_out(1)");
      pTVar1 = g_current_test;
      bVar3 = Edge::is_implicit_out(local_20,2);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3f2,"edge->is_implicit_out(2)");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, ImplicitOutputDupe) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build foo baz | foo baq foo: cat bar\n"));

  Edge* edge = state.LookupNode("foo")->in_edge();
  ASSERT_EQ(edge->outputs_.size(), 3);
  EXPECT_FALSE(edge->is_implicit_out(0));
  EXPECT_FALSE(edge->is_implicit_out(1));
  EXPECT_TRUE(edge->is_implicit_out(2));
}